

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O3

void gnilk::Logger::SetAllSinkDebugLevel(LogLevel newDebugLevel)

{
  LogManager *this;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  this = LogManager::Instance();
  local_28._8_8_ = 0;
  local_28._4_4_ = 0;
  local_28._0_4_ = newDebugLevel;
  local_10 = std::
             _Function_handler<bool_(gnilk::LogSink_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/gnklog.cpp:93:41)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(gnilk::LogSink_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/gnklog.cpp:93:41)>
             ::_M_manager;
  LogManager::IterateSinks(this,(SinkDelegate *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void Logger::SetAllSinkDebugLevel(LogLevel newDebugLevel) {
    LogManager::Instance().IterateSinks([newDebugLevel](LogSink *sink) {
        sink->SetLogLevelThreshold(newDebugLevel);
        return true;
    });
}